

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCTas.c
# Opt level: O3

int Tas_ManAnalyze(Tas_Man_t *p,int Level,Gia_Obj_t *pVar,Gia_Obj_t *pFan0,Gia_Obj_t *pFan1)

{
  Gia_Obj_t **ppGVar1;
  int iVar2;
  size_t sVar3;
  int iVar4;
  int iVar5;
  
  if ((pVar->field_0x3 & 0x40) == 0) {
    __assert_fail("Tas_VarIsAssigned(pVar)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCTas.c"
                  ,0x350,
                  "int Tas_ManAnalyze(Tas_Man_t *, int, Gia_Obj_t *, Gia_Obj_t *, Gia_Obj_t *)");
  }
  if ((pFan0->field_0x3 & 0x40) == 0) {
    __assert_fail("Tas_VarIsAssigned(pFan0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCTas.c"
                  ,0x351,
                  "int Tas_ManAnalyze(Tas_Man_t *, int, Gia_Obj_t *, Gia_Obj_t *, Gia_Obj_t *)");
  }
  if ((pFan1 != (Gia_Obj_t *)0x0) && ((pFan1->field_0x3 & 0x40) == 0)) {
    __assert_fail("pFan1 == NULL || Tas_VarIsAssigned(pFan1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCTas.c"
                  ,0x352,
                  "int Tas_ManAnalyze(Tas_Man_t *, int, Gia_Obj_t *, Gia_Obj_t *, Gia_Obj_t *)");
  }
  iVar2 = (p->pClauses).iHead;
  if (iVar2 != (p->pClauses).iTail) {
    __assert_fail("Tas_QueIsEmpty( pQue )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCTas.c"
                  ,0x353,
                  "int Tas_ManAnalyze(Tas_Man_t *, int, Gia_Obj_t *, Gia_Obj_t *, Gia_Obj_t *)");
  }
  iVar4 = (p->pClauses).nSize;
  if (iVar2 == iVar4) {
    iVar4 = iVar2 * 2;
    (p->pClauses).nSize = iVar4;
    ppGVar1 = (p->pClauses).pData;
    if (ppGVar1 == (Gia_Obj_t **)0x0) {
      ppGVar1 = (Gia_Obj_t **)malloc((long)iVar2 << 4);
    }
    else {
      ppGVar1 = (Gia_Obj_t **)realloc(ppGVar1,(long)iVar2 << 4);
      iVar2 = (p->pClauses).iTail;
      iVar4 = (p->pClauses).nSize;
    }
    (p->pClauses).pData = ppGVar1;
  }
  else {
    ppGVar1 = (p->pClauses).pData;
  }
  iVar5 = iVar2 + 1;
  (p->pClauses).iTail = iVar5;
  ppGVar1[iVar2] = (Gia_Obj_t *)0x0;
  if (iVar5 == iVar4) {
    iVar2 = iVar4 * 2;
    (p->pClauses).nSize = iVar2;
    ppGVar1 = (p->pClauses).pData;
    if (ppGVar1 == (Gia_Obj_t **)0x0) {
      ppGVar1 = (Gia_Obj_t **)malloc((long)iVar2 << 3);
      iVar5 = iVar4;
      iVar4 = iVar2;
    }
    else {
      ppGVar1 = (Gia_Obj_t **)realloc(ppGVar1,(long)iVar2 << 3);
      iVar5 = (p->pClauses).iTail;
      iVar4 = (p->pClauses).nSize;
    }
    (p->pClauses).pData = ppGVar1;
  }
  else {
    ppGVar1 = (p->pClauses).pData;
  }
  iVar2 = iVar5 + 1;
  (p->pClauses).iTail = iVar2;
  ppGVar1[iVar5] = pVar;
  if (iVar2 == iVar4) {
    (p->pClauses).nSize = iVar4 * 2;
    ppGVar1 = (p->pClauses).pData;
    sVar3 = (long)(iVar4 * 2) << 3;
    if (ppGVar1 == (Gia_Obj_t **)0x0) {
      ppGVar1 = (Gia_Obj_t **)malloc(sVar3);
    }
    else {
      ppGVar1 = (Gia_Obj_t **)realloc(ppGVar1,sVar3);
      iVar4 = (p->pClauses).iTail;
    }
    (p->pClauses).pData = ppGVar1;
    iVar2 = iVar4;
  }
  else {
    ppGVar1 = (p->pClauses).pData;
  }
  iVar4 = iVar2 + 1;
  (p->pClauses).iTail = iVar4;
  ppGVar1[iVar2] = pFan0;
  if (pFan1 != (Gia_Obj_t *)0x0) {
    if (iVar4 == (p->pClauses).nSize) {
      (p->pClauses).nSize = iVar4 * 2;
      ppGVar1 = (p->pClauses).pData;
      sVar3 = (long)(iVar4 * 2) << 3;
      if (ppGVar1 == (Gia_Obj_t **)0x0) {
        ppGVar1 = (Gia_Obj_t **)malloc(sVar3);
      }
      else {
        ppGVar1 = (Gia_Obj_t **)realloc(ppGVar1,sVar3);
        iVar4 = (p->pClauses).iTail;
      }
      (p->pClauses).pData = ppGVar1;
    }
    else {
      ppGVar1 = (p->pClauses).pData;
    }
    (p->pClauses).iTail = iVar4 + 1;
    ppGVar1[iVar4] = pFan1;
  }
  Tas_ManDeriveReason(p,Level);
  iVar2 = (p->pClauses).iHead;
  iVar4 = (p->pClauses).iTail;
  if (iVar2 < iVar4) {
    if (iVar4 == (p->pClauses).nSize) {
      (p->pClauses).nSize = iVar4 * 2;
      ppGVar1 = (p->pClauses).pData;
      if (ppGVar1 == (Gia_Obj_t **)0x0) {
        ppGVar1 = (Gia_Obj_t **)malloc((long)iVar4 << 4);
      }
      else {
        ppGVar1 = (Gia_Obj_t **)realloc(ppGVar1,(long)iVar4 << 4);
        iVar4 = (p->pClauses).iTail;
      }
      (p->pClauses).pData = ppGVar1;
    }
    else {
      ppGVar1 = (p->pClauses).pData;
    }
    (p->pClauses).iTail = iVar4 + 1;
    ppGVar1[iVar4] = (Gia_Obj_t *)0x0;
    (p->pClauses).iHead = iVar4 + 1;
    return iVar2;
  }
  __assert_fail("p->iHead < p->iTail",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCTas.c"
                ,0x1a5,"int Tas_QueFinish(Tas_Que_t *)");
}

Assistant:

static inline int Tas_ManAnalyze( Tas_Man_t * p, int Level, Gia_Obj_t * pVar, Gia_Obj_t * pFan0, Gia_Obj_t * pFan1 )
{
    Tas_Que_t * pQue = &(p->pClauses);
    assert( Tas_VarIsAssigned(pVar) );
    assert( Tas_VarIsAssigned(pFan0) );
    assert( pFan1 == NULL || Tas_VarIsAssigned(pFan1) );
    assert( Tas_QueIsEmpty( pQue ) );
    Tas_QuePush( pQue, NULL );
    Tas_QuePush( pQue, pVar );
    Tas_QuePush( pQue, pFan0 );
    if ( pFan1 )
        Tas_QuePush( pQue, pFan1 );
    Tas_ManDeriveReason( p, Level );
    return Tas_QueFinish( pQue );
}